

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::rehash(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  uint uVar2;
  void *p;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  raw_node *prVar7;
  raw_node *prVar8;
  raw_node *prVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  new_map;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  local_48;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar6 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_48.m_values.m_p = (raw_node *)0x0;
    local_48.m_values.m_size = 0;
    local_48.m_values.m_capacity = 0;
    local_48.m_hash_shift = 0x20;
    local_48.m_num_valid = 0;
    local_48.m_grow_threshold = 0;
    uVar10 = -new_hash_size;
    if (uVar10 != 0) {
      if (new_hash_size != 0 || uVar10 == 0) {
        if (new_hash_size != 0) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_48,new_hash_size,new_hash_size == 1,0x20,
                     vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
                     ::object_mover,false);
        }
        if (new_hash_size - local_48.m_values.m_size != 0) {
          lVar13 = 0;
          do {
            local_48.m_values.m_p[local_48.m_values._8_8_ & 0xffffffff].m_bits[lVar13 + 0x1c] = '\0'
            ;
            lVar13 = lVar13 + 0x20;
          } while ((ulong)(new_hash_size - local_48.m_values.m_size) << 5 != lVar13);
        }
      }
      else {
        lVar13 = 0;
        do {
          if ((*(char *)(uVar6 * 0x20 + 0x1c + lVar13) != '\0') &&
             (p = *(void **)(uVar6 * 0x20 + lVar13), p != (void *)0x0)) {
            crnlib_free(p);
          }
          lVar13 = lVar13 + 0x20;
        } while ((ulong)uVar10 << 5 != lVar13);
      }
      local_48.m_values.m_size = new_hash_size;
    }
    uVar3 = local_48._24_8_;
    local_48.m_hash_shift = 0x20;
    if (1 < new_hash_size) {
      do {
        local_48.m_hash_shift = local_48.m_hash_shift - 1;
        uVar10 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
      } while (3 < uVar10);
    }
    local_48._24_8_ = local_48._24_8_ & 0xffffffff;
    uVar4 = local_48._24_8_;
    local_48.m_num_valid = (uint)uVar3;
    uVar6 = (ulong)(this->m_values).m_size;
    if (uVar6 != 0) {
      prVar9 = (this->m_values).m_p;
      prVar7 = prVar9 + uVar6;
      local_48._24_8_ = uVar4;
      do {
        if (prVar9->m_bits[0x1c] != '\0') {
          uVar10 = (uint)(*(int *)(prVar9->m_bits + 0x10) * -0x61c88647) >>
                   ((byte)local_48.m_hash_shift & 0x1f);
          prVar8 = local_48.m_values.m_p + uVar10;
          if (local_48.m_values.m_p[uVar10].m_bits[0x1c] != '\0') {
            uVar12 = uVar10;
            do {
              uVar11 = uVar12 - 1;
              if (uVar12 == 0) {
                uVar11 = local_48.m_values.m_size - 1;
              }
              if (uVar11 == uVar10) goto LAB_0013ca1a;
              prVar8 = prVar8 + -1;
              if (uVar12 == 0) {
                prVar8 = local_48.m_values.m_p + (local_48.m_values.m_size - 1);
              }
              uVar12 = uVar11;
            } while (prVar8->m_bits[0x1c] != '\0');
          }
          uVar3 = *(undefined8 *)prVar9->m_bits;
          uVar4 = *(undefined8 *)(prVar9->m_bits + 8);
          uVar5 = *(undefined8 *)(prVar9->m_bits + 0x18);
          *(undefined8 *)(prVar8->m_bits + 0x10) = *(undefined8 *)(prVar9->m_bits + 0x10);
          *(undefined8 *)(prVar8->m_bits + 0x18) = uVar5;
          *(undefined8 *)prVar8->m_bits = uVar3;
          *(undefined8 *)(prVar8->m_bits + 8) = uVar4;
          prVar9->m_bits[0x1c] = '\0';
          local_48.m_grow_threshold = 0;
          local_48.m_num_valid = local_48.m_num_valid + 1;
LAB_0013ca1a:
          if (local_48.m_num_valid == this->m_num_valid) break;
        }
        prVar9 = prVar9 + 1;
      } while (prVar9 != prVar7);
    }
    local_48.m_grow_threshold = new_hash_size + 1 >> 1;
    prVar9 = (this->m_values).m_p;
    if (prVar9 != (raw_node *)0x0) {
      crnlib_free(prVar9);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar9 = (this->m_values).m_p;
    (this->m_values).m_p = local_48.m_values.m_p;
    uVar1 = (this->m_values).m_size;
    (this->m_values).m_size = local_48.m_values.m_size;
    uVar2 = (this->m_values).m_capacity;
    (this->m_values).m_capacity = local_48.m_values.m_capacity;
    local_48.m_values.m_capacity = uVar2;
    local_48.m_values.m_size = uVar1;
    this->m_hash_shift = local_48.m_hash_shift;
    local_48.m_hash_shift = 0x20;
    uVar1 = this->m_num_valid;
    this->m_num_valid = local_48.m_num_valid;
    uVar2 = this->m_grow_threshold;
    this->m_grow_threshold = local_48.m_grow_threshold;
    local_48.m_grow_threshold = uVar2;
    local_48.m_num_valid = uVar1;
    local_48.m_values.m_p = prVar9;
    ~hash_map(&local_48);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }